

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::CopyBuffer
          (DeviceContextVkImpl *this,IBuffer *pSrcBuffer,Uint64 SrcOffset,
          RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,IBuffer *pDstBuffer,
          Uint64 DstOffset,Uint64 Size,RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)

{
  Uint32 *pUVar1;
  BufferVkImpl *Buffer;
  BufferVkImpl *Buffer_00;
  size_t sVar2;
  VkBuffer srcBuffer;
  VkBuffer dstBuffer;
  char (*Args_1) [40];
  string msg;
  VkBufferCopy CopyRegion;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pSrcBuffer,SrcOffset,
             SrcBufferTransitionMode,pDstBuffer,DstOffset,Size,DstBufferTransitionMode);
  Buffer = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pSrcBuffer);
  Buffer_00 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pDstBuffer);
  if ((Buffer_00->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Usage == USAGE_DYNAMIC) {
    FormatString<char[44]>(&msg,(char (*) [44])"Dynamic buffers cannot be copy destinations");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x85c);
    std::__cxx11::string::~string((string *)&msg);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBufferState
            (this,Buffer,SrcBufferTransitionMode,RESOURCE_STATE_COPY_SOURCE,
             VK_ACCESS_TRANSFER_READ_BIT,
             "Using buffer as copy source (DeviceContextVkImpl::CopyBuffer)");
  Args_1 = (char (*) [40])0x800;
  TransitionOrVerifyBufferState
            (this,Buffer_00,DstBufferTransitionMode,RESOURCE_STATE_COPY_DEST,
             VK_ACCESS_TRANSFER_WRITE_BIT,
             "Using buffer as copy destination (DeviceContextVkImpl::CopyBuffer)");
  sVar2 = GetDynamicBufferOffset(this,Buffer,true);
  CopyRegion.srcOffset = sVar2 + SrcOffset;
  CopyRegion.size = Size;
  CopyRegion.dstOffset = DstOffset;
  if ((Buffer_00->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
    FormatString<char[49]>(&msg,(char (*) [49])"Copy destination buffer must not be suballocated");
    Args_1 = (char (*) [40])0x866;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x866);
    std::__cxx11::string::~string((string *)&msg);
  }
  sVar2 = GetDynamicBufferOffset(this,Buffer_00,true);
  if (sVar2 != 0) {
    FormatString<char[26],char[40]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"GetDynamicBufferOffset(pDstBuffVk) == 0",Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x867);
    std::__cxx11::string::~string((string *)&msg);
  }
  srcBuffer = BufferVkImpl::GetVkBuffer(Buffer);
  dstBuffer = BufferVkImpl::GetVkBuffer(Buffer_00);
  VulkanUtilities::VulkanCommandBuffer::CopyBuffer
            (&this->m_CommandBuffer,srcBuffer,dstBuffer,1,&CopyRegion);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::CopyBuffer(IBuffer*                       pSrcBuffer,
                                     Uint64                         SrcOffset,
                                     RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
                                     IBuffer*                       pDstBuffer,
                                     Uint64                         DstOffset,
                                     Uint64                         Size,
                                     RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)
{
    TDeviceContextBase::CopyBuffer(pSrcBuffer, SrcOffset, SrcBufferTransitionMode, pDstBuffer, DstOffset, Size, DstBufferTransitionMode);

    BufferVkImpl* pSrcBuffVk = ClassPtrCast<BufferVkImpl>(pSrcBuffer);
    BufferVkImpl* pDstBuffVk = ClassPtrCast<BufferVkImpl>(pDstBuffer);

    DEV_CHECK_ERR(pDstBuffVk->GetDesc().Usage != USAGE_DYNAMIC, "Dynamic buffers cannot be copy destinations");

    EnsureVkCmdBuffer();
    TransitionOrVerifyBufferState(*pSrcBuffVk, SrcBufferTransitionMode, RESOURCE_STATE_COPY_SOURCE, VK_ACCESS_TRANSFER_READ_BIT, "Using buffer as copy source (DeviceContextVkImpl::CopyBuffer)");
    TransitionOrVerifyBufferState(*pDstBuffVk, DstBufferTransitionMode, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, "Using buffer as copy destination (DeviceContextVkImpl::CopyBuffer)");

    VkBufferCopy CopyRegion;
    CopyRegion.srcOffset = SrcOffset + GetDynamicBufferOffset(pSrcBuffVk);
    CopyRegion.dstOffset = DstOffset;
    CopyRegion.size      = Size;
    VERIFY(pDstBuffVk->m_VulkanBuffer != VK_NULL_HANDLE, "Copy destination buffer must not be suballocated");
    VERIFY_EXPR(GetDynamicBufferOffset(pDstBuffVk) == 0);
    m_CommandBuffer.CopyBuffer(pSrcBuffVk->GetVkBuffer(), pDstBuffVk->GetVkBuffer(), 1, &CopyRegion);
    ++m_State.NumCommands;
}